

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  Mat *pMVar3;
  size_t _elemsize;
  size_t sVar4;
  int *piVar5;
  pointer pMVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  float *pfVar21;
  ulong uVar22;
  uint _w;
  uint uVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  undefined4 *puVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  ulong local_108;
  Mat local_f8;
  Mat local_a8;
  Gemm *local_58;
  void *local_50;
  void *local_48;
  long local_40;
  long local_38;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _elemsize = pMVar3->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  local_58 = this;
  if (this->transA == 0) {
    if (&local_f8 != pMVar3) {
      piVar5 = pMVar3->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      local_f8.data = pMVar3->data;
      local_f8.refcount._0_4_ = SUB84(pMVar3->refcount,0);
      local_f8.refcount._4_4_ = (undefined4)((ulong)pMVar3->refcount >> 0x20);
      local_f8.elemsize._0_4_ = (undefined4)pMVar3->elemsize;
      local_f8.elemsize._4_4_ = (undefined4)(pMVar3->elemsize >> 0x20);
      local_f8.elempack = pMVar3->elempack;
      local_f8.allocator = pMVar3->allocator;
      uVar7 = pMVar3->dims;
      uVar8 = pMVar3->w;
      uVar9 = pMVar3->h;
      uVar10 = pMVar3->d;
      local_f8.c = pMVar3->c;
      local_f8.cstep = pMVar3->cstep;
      local_f8.dims = uVar7;
      local_f8.w = uVar8;
      local_f8.h = uVar9;
      local_f8.d = uVar10;
    }
  }
  else {
    Mat::create(&local_f8,pMVar3->h,pMVar3->w,_elemsize,opt->workspace_allocator);
    if (0 < (long)local_f8.h) {
      lVar24 = 0;
      lVar26 = 0;
      pvVar18 = local_f8.data;
      do {
        if (0 < local_f8.w) {
          iVar16 = pMVar3->w;
          sVar4 = pMVar3->elemsize;
          puVar29 = (undefined4 *)((long)pMVar3->data + lVar24);
          uVar31 = 0;
          do {
            *(undefined4 *)((long)pvVar18 + uVar31 * 4) = *puVar29;
            uVar31 = uVar31 + 1;
            puVar29 = (undefined4 *)((long)puVar29 + (long)iVar16 * sVar4);
          } while ((uint)local_f8.w != uVar31);
        }
        lVar26 = lVar26 + 1;
        pvVar18 = (void *)((long)pvVar18 +
                          (long)local_f8.w *
                          CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
        lVar24 = lVar24 + 4;
      } while (lVar26 != local_f8.h);
    }
  }
  local_a8.cstep = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.elempack = 0;
  local_a8.allocator = (Allocator *)0x0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.d = 0;
  local_a8.c = 0;
  if (local_58->transB == 0) {
    Mat::create(&local_a8,pMVar3[1].h,pMVar3[1].w,_elemsize,opt->workspace_allocator);
    local_108 = (ulong)local_a8.h;
    if (0 < (long)local_108) {
      lVar24 = 0;
      uVar31 = 0;
      pvVar18 = local_a8.data;
      do {
        if (0 < local_a8.w) {
          iVar16 = pMVar3[1].w;
          sVar4 = pMVar3[1].elemsize;
          puVar29 = (undefined4 *)((long)pMVar3[1].data + lVar24);
          uVar30 = 0;
          do {
            *(undefined4 *)((long)pvVar18 + uVar30 * 4) = *puVar29;
            uVar30 = uVar30 + 1;
            puVar29 = (undefined4 *)((long)puVar29 + (long)iVar16 * sVar4);
          } while ((uint)local_a8.w != uVar30);
        }
        uVar31 = uVar31 + 1;
        pvVar18 = (void *)((long)pvVar18 +
                          (long)local_a8.w *
                          CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize));
        lVar24 = lVar24 + 4;
      } while (uVar31 != local_108);
    }
  }
  else if (&local_a8 == pMVar3 + 1) {
    local_108 = 0;
  }
  else {
    piVar5 = pMVar3[1].refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_a8.data = pMVar3[1].data;
    local_a8.refcount._0_4_ = SUB84(pMVar3[1].refcount,0);
    local_a8.refcount._4_4_ = (undefined4)((ulong)pMVar3[1].refcount >> 0x20);
    local_a8.elemsize._0_4_ = (undefined4)pMVar3[1].elemsize;
    local_a8.elemsize._4_4_ = (undefined4)(pMVar3[1].elemsize >> 0x20);
    local_a8.elempack = pMVar3[1].elempack;
    local_a8.allocator = pMVar3[1].allocator;
    uVar11 = pMVar3[1].dims;
    uVar12 = pMVar3[1].w;
    uVar13 = pMVar3[1].h;
    uVar14 = pMVar3[1].d;
    local_108 = (ulong)(uint)pMVar3[1].h;
    local_a8.c = pMVar3[1].c;
    local_a8.cstep = pMVar3[1].cstep;
    local_a8.dims = uVar11;
    local_a8.w = uVar12;
    local_a8.h = uVar13;
    local_a8.d = uVar14;
  }
  iVar15 = local_f8.h;
  iVar16 = local_f8.w;
  uVar31 = (ulong)(uint)local_f8.h;
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar24 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar6;
  _w = (uint)local_108;
  if (lVar24 == 0xd8) {
    uVar1 = pMVar6[2].w;
    bVar33 = uVar1 == local_f8.h && pMVar6[2].dims == 1;
    uVar25 = (uint)bVar33;
    uVar2 = pMVar6[2].h;
    uVar23 = 2;
    if (uVar2 != local_f8.h) {
      uVar23 = (uint)bVar33;
    }
    if (uVar1 != 1) {
      uVar23 = uVar25;
    }
    bVar33 = pMVar6[2].dims != 2;
    if (bVar33) {
      uVar23 = uVar25;
    }
    uVar27 = 3;
    if (uVar2 != local_f8.h) {
      uVar27 = (ulong)uVar23;
    }
    if (bVar33 || uVar1 != _w) {
      uVar27 = (ulong)uVar23;
    }
    uVar30 = 4;
    if (uVar2 != 1) {
      uVar30 = uVar27;
    }
    pvVar18 = pMVar6[2].data;
    if (bVar33 || uVar1 != _w) {
      uVar30 = uVar27;
    }
  }
  else {
    pvVar18 = (void *)0x0;
    uVar30 = 0;
  }
  uVar27 = (ulong)(uint)local_f8.w;
  pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar3,_w,local_f8.h,_elemsize,opt->blob_allocator);
  pfVar21 = (float *)pMVar3->data;
  iVar17 = -100;
  if ((pfVar21 != (float *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
    if (0 < iVar15) {
      local_48 = local_a8.data;
      lVar26 = (long)local_a8.w * CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
      local_40 = (long)local_f8.w * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
      uVar28 = 0;
      pvVar19 = local_f8.data;
      do {
        if (0 < (int)_w) {
          local_38 = uVar28 * (local_108 & 0xffffffff);
          local_50 = (void *)((long)pvVar18 + uVar28 * 4);
          uVar22 = 0;
          pvVar20 = local_a8.data;
          do {
            fVar34 = 0.0;
            if (lVar24 == 0xd8) {
              iVar16 = (*(code *)(&DAT_003188bc + *(int *)(&DAT_003188bc + uVar30 * 4)))
                                 (lVar26,&DAT_003188bc + *(int *)(&DAT_003188bc + uVar30 * 4));
              return iVar16;
            }
            if (0 < iVar16) {
              uVar32 = 0;
              do {
                fVar34 = fVar34 + *(float *)((long)pvVar20 + uVar32 * 4) *
                                  *(float *)((long)pvVar19 + uVar32 * 4);
                uVar32 = uVar32 + 1;
              } while (uVar27 != uVar32);
            }
            *pfVar21 = fVar34 * local_58->alpha;
            pfVar21 = pfVar21 + 1;
            uVar22 = uVar22 + 1;
            pvVar20 = (void *)((long)pvVar20 + lVar26);
          } while (uVar22 != (local_108 & 0xffffffff));
        }
        uVar28 = uVar28 + 1;
        pvVar19 = (void *)((long)pvVar19 + local_40);
      } while (uVar28 != uVar31);
    }
    iVar17 = 0;
  }
  piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = bottom_blobs[0];
    const Mat& B0 = bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create(A0.h, A0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0.row(j)[i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create(B0.h, B0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0.row(j)[i];
            }
        }
    }
    else
    {
        B = B0;
    }

    int M = A.h;
    int K = A.w; // assert A.w == B.w
    int N = B.h;

    bool has_C = bottom_blobs.size() == 3;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (has_C)
    {
        const Mat& C = bottom_blobs[2];

        ptrC = C;

        if (C.dims == 1 && C.w == 1)
        {
            // scalar
            broadcast_type_C = 0;
        }
        if (C.dims == 1 && C.w == M)
        {
            // M
            // auto broadcast from h to w is the ncnn-style convention
            broadcast_type_C = 1;
        }
        if (C.dims == 2 && C.w == 1 && C.h == M)
        {
            // Mx1
            broadcast_type_C = 2;
        }
        if (C.dims == 2 && C.w == N && C.h == M)
        {
            // MxN
            broadcast_type_C = 3;
        }
        if (C.dims == 2 && C.w == N && C.h == 1)
        {
            // 1xN
            broadcast_type_C = 4;
        }
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(N, M, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* outptr = top_blob;
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = A.row(i);

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = B.row(j);

            float sum = 0.f;
            if (has_C)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum * alpha;
        }
    }

    return 0;
}